

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

char * luaT_objtypename(lua_State *L,TValue *o)

{
  Table *t;
  Value *pVVar1;
  TString *key;
  GCObject *pGVar2;
  byte bVar3;
  
  if (o->tt_ == 'G') {
    t = *(Table **)((o->value_).f + 0x18);
  }
  else {
    if (o->tt_ != 'E') goto LAB_0011cc10;
    t = *(Table **)((o->value_).f + 0x20);
  }
  if (t != (Table *)0x0) {
    key = luaS_new(L,"__name");
    pGVar2 = (GCObject *)luaH_Hgetshortstr(t,key);
    bVar3 = pGVar2->tt & 0xf;
    if ((bVar3 == 4) &&
       (pVVar1 = (Value *)&pGVar2->next, pGVar2 = (GCObject *)(pVVar1->f + 0x18),
       (char)pVVar1->f[0xb] < '\0')) {
      pGVar2 = ((Value *)&pGVar2->next)->gc;
    }
    if (bVar3 == 4) {
      return (char *)pGVar2;
    }
  }
LAB_0011cc10:
  return luaT_typenames_[(ulong)(o->tt_ & 0xf) + 1];
}

Assistant:

const char *luaT_objtypename (lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttistable(o) && (mt = hvalue(o)->metatable) != NULL) ||
      (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_Hgetshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  return ttypename(ttype(o));  /* else use standard type name */
}